

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_pbeh.c
# Opt level: O1

void hyb_gga_xc_pbemol0_init(xc_func_type *p)

{
  xc_mix_init(p,2,hyb_gga_xc_pbemol0_init::funcs_id,hyb_gga_xc_pbemol0_init::funcs_coef);
  xc_hyb_init_hybrid(p,0.0);
  return;
}

Assistant:

static void
hyb_gga_xc_pbemol0_init(xc_func_type *p)
{
  static int   funcs_id  [2] = {XC_GGA_X_PBE_MOL, XC_GGA_C_PBE_MOL};
  static double funcs_coef[2] = {0.0, 1.0};

  /* Note that the value of funcs_coef[0] and hyb_coeff will be set
      by set_ext_params */
  xc_mix_init(p, 2, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, 0.0);
}